

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_bool_expr.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformBoolExpr(Transformer *this,PGBoolExpr *root)

{
  int iVar1;
  _Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_> _Var2
  ;
  ExpressionType EVar3;
  pointer pPVar4;
  pointer pPVar5;
  optional_ptr<duckdb::Transformer,_true> this_00;
  type expr;
  long in_RDX;
  pointer *__ptr_1;
  pointer *__ptr;
  long lVar6;
  pointer __old_p;
  Transformer *pTVar7;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_48
  ;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_40;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_38;
  
  (this->parent).ptr = (Transformer *)0x0;
  lVar6 = *(long *)(*(long *)(in_RDX + 8) + 8);
  if (lVar6 != 0) {
    pTVar7 = (Transformer *)0x0;
    do {
      TransformExpression((Transformer *)&stack0xffffffffffffffb8,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
      iVar1 = *(int *)(in_RDX + 4);
      if (iVar1 == 0) {
        _Var2.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)(this->parent).ptr;
        if (_Var2.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (ParsedExpression *)0x0) {
          this_00.ptr = (Transformer *)operator_new(0x50);
          (this->parent).ptr = (Transformer *)0x0;
          local_40._M_head_impl =
               (ParsedExpression *)
               local_48._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
               (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                )0x0;
          local_38._M_head_impl =
               (ParsedExpression *)
               _Var2.super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          ConjunctionExpression::ConjunctionExpression
                    ((ConjunctionExpression *)this_00.ptr,CONJUNCTION_AND,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&stack0xffffffffffffffc8,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&stack0xffffffffffffffc0);
          goto LAB_01779d26;
        }
LAB_01779d5f:
        (this->parent).ptr =
             (Transformer *)
             local_48._M_t.
             super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
        this_00.ptr = (Transformer *)
                      local_48._M_t.
                      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      }
      else {
        if (iVar1 == 1) {
          if (pTVar7 == (Transformer *)0x0) goto LAB_01779d5f;
          this_00.ptr = (Transformer *)operator_new(0x50);
          local_38._M_head_impl = (ParsedExpression *)(this->parent).ptr;
          (this->parent).ptr = (Transformer *)0x0;
          local_40._M_head_impl =
               (ParsedExpression *)
               local_48._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          local_48._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
               (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                )0x0;
          ConjunctionExpression::ConjunctionExpression
                    ((ConjunctionExpression *)this_00.ptr,CONJUNCTION_OR,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&stack0xffffffffffffffc8,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&stack0xffffffffffffffc0);
LAB_01779d26:
          if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_40._M_head_impl !=
              (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
            (*((BaseExpression *)
              &((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
              _vptr_BaseExpression[1])();
          }
          local_40._M_head_impl = (ParsedExpression *)0x0;
          if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_38._M_head_impl !=
              (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
            (*((BaseExpression *)
              &((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
              _vptr_BaseExpression[1])();
          }
          (this->parent).ptr = this_00.ptr;
        }
        else {
          this_00.ptr = pTVar7;
          if (iVar1 == 2) {
            pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)&stack0xffffffffffffffb8);
            if ((pPVar4->super_BaseExpression).type == COMPARE_IN) {
              pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)&stack0xffffffffffffffb8);
              (pPVar4->super_BaseExpression).type = COMPARE_NOT_IN;
LAB_01779c7d:
              this_00.ptr = (Transformer *)
                            local_48._M_t.
                            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
              local_48._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                   (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                    )(_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                      )0x0;
              (this->parent).ptr = this_00.ptr;
              if (pTVar7 == (Transformer *)0x0) goto LAB_01779e2d;
            }
            else {
              pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)&stack0xffffffffffffffb8);
              if ((~LAMBDA < (pPVar4->super_BaseExpression).type) &&
                 (pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                         *)&stack0xffffffffffffffb8),
                 (pPVar4->super_BaseExpression).type < 0x1f)) {
                pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                       *)&stack0xffffffffffffffb8);
                pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                       *)&stack0xffffffffffffffb8);
                EVar3 = NegateComparisonExpression((pPVar5->super_BaseExpression).type);
                (pPVar4->super_BaseExpression).type = EVar3;
                goto LAB_01779c7d;
              }
              this_00.ptr = (Transformer *)operator_new(0x50);
              local_38._M_head_impl =
                   (ParsedExpression *)
                   local_48._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
              local_48._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                   (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                    )(_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                      )0x0;
              local_40._M_head_impl = (ParsedExpression *)0x0;
              OperatorExpression::OperatorExpression
                        ((OperatorExpression *)this_00.ptr,OPERATOR_NOT,
                         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)&stack0xffffffffffffffc8,
                         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)&stack0xffffffffffffffc0);
              if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   )local_40._M_head_impl != (ParsedExpression *)0x0) {
                (**(code **)(*(long *)local_40._M_head_impl + 8))();
              }
              local_40._M_head_impl = (ParsedExpression *)0x0;
              if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_38._M_head_impl !=
                  (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
                (*((BaseExpression *)
                  &((local_38._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
                  _vptr_BaseExpression[1])();
              }
              (this->parent).ptr = this_00.ptr;
              if (pTVar7 == (Transformer *)0x0) goto LAB_01779e1e;
            }
            (*(((ParsedExpression *)&pTVar7->parent)->super_BaseExpression)._vptr_BaseExpression[1])
                      (pTVar7);
          }
        }
LAB_01779e1e:
        if (local_48._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             )0x0) {
          (*(((ParsedExpression *)
             &((Transformer *)
              local_48._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl)->parent)->
            super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
LAB_01779e2d:
      lVar6 = *(long *)(lVar6 + 8);
      pTVar7 = this_00.ptr;
    } while (lVar6 != 0);
  }
  expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
         operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)this);
  SetQueryLocation(expr,*(int *)(in_RDX + 0x10));
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformBoolExpr(duckdb_libpgquery::PGBoolExpr &root) {
	unique_ptr<ParsedExpression> result;
	for (auto node = root.args->head; node != nullptr; node = node->next) {
		auto next = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value));

		switch (root.boolop) {
		case duckdb_libpgquery::PG_AND_EXPR: {
			if (!result) {
				result = std::move(next);
			} else {
				result = make_uniq<ConjunctionExpression>(ExpressionType::CONJUNCTION_AND, std::move(result),
				                                          std::move(next));
			}
			break;
		}
		case duckdb_libpgquery::PG_OR_EXPR: {
			if (!result) {
				result = std::move(next);
			} else {
				result = make_uniq<ConjunctionExpression>(ExpressionType::CONJUNCTION_OR, std::move(result),
				                                          std::move(next));
			}
			break;
		}
		case duckdb_libpgquery::PG_NOT_EXPR: {
			if (next->GetExpressionType() == ExpressionType::COMPARE_IN) {
				// convert COMPARE_IN to COMPARE_NOT_IN
				next->SetExpressionTypeUnsafe(ExpressionType::COMPARE_NOT_IN);
				result = std::move(next);
			} else if (next->GetExpressionType() >= ExpressionType::COMPARE_EQUAL &&
			           next->GetExpressionType() <= ExpressionType::COMPARE_GREATERTHANOREQUALTO) {
				// NOT on a comparison: we can negate the comparison
				// e.g. NOT(x > y) is equivalent to x <= y
				next->SetExpressionTypeUnsafe(NegateComparisonExpression(next->GetExpressionType()));
				result = std::move(next);
			} else {
				result = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(next));
			}
			break;
		}
		}
	}
	SetQueryLocation(*result, root.location);
	return result;
}